

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O3

int __thiscall
section_data::pull_used_layers
          (section_data *this,vector<int,_std::allocator<int>_> *destination_vector)

{
  iterator __position;
  undefined8 in_RAX;
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  undefined8 uStack_28;
  
  p_Var1 = (this->polygons)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->polygons)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    uStack_28 = in_RAX;
    do {
      uStack_28 = CONCAT44(p_Var1[1]._M_color,(undefined4)uStack_28);
      __position._M_current =
           (destination_vector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (destination_vector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (destination_vector,__position,(int *)((long)&uStack_28 + 4));
      }
      else {
        *__position._M_current = p_Var1[1]._M_color;
        (destination_vector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return 0;
}

Assistant:

int section_data::pull_used_layers(vector<int> &destination_vector)
{
  for (auto it = polygons.begin(); it != polygons.end(); ++it) {
    destination_vector.push_back(it->first);
  }
  return EXIT_SUCCESS;
}